

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week8-midterm.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  allocator<Employee> *this;
  initializer_list<float> __l;
  initializer_list<Employee> __l_00;
  ostream *poVar1;
  reference e;
  array<float,_4UL> aVar2;
  float local_408;
  float fStack_404;
  float local_3f8;
  float fStack_3f4;
  Employee *local_378;
  allocator<float> local_311;
  float local_310 [4];
  iterator local_300;
  size_type local_2f8;
  vector<float,_std::allocator<float>_> local_2f0;
  vector<float,_std::allocator<float>_> local_2d8;
  array<float,_4UL> local_2bc;
  float local_2ac;
  float fStack_2a8;
  float local_2a4;
  float fStack_2a0;
  _Type local_298;
  undefined4 local_284;
  undefined4 local_280;
  undefined4 local_27c;
  _Type local_278;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  local_268;
  undefined1 local_230 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  grouped_transformed;
  undefined1 local_1f8 [6];
  anon_class_1_0_00000001 lambda_transform;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  grouped;
  undefined1 local_1c0 [6];
  anon_class_1_0_00000001 lambda_group;
  vector<Employee,_std::allocator<Employee>_> local_198;
  int *local_180;
  undefined1 local_178 [8];
  vector<Employee,_std::allocator<Employee>_> age_gt_40;
  anon_class_8_1_3dfc913a lambda_filter;
  int age_thresh;
  allocator<char> local_139;
  Employee *local_138;
  Employee local_130;
  string local_100 [32];
  undefined4 local_e0;
  undefined4 local_dc;
  undefined4 local_d8;
  string local_d0 [32];
  undefined4 local_b0;
  undefined4 local_ac;
  undefined4 local_a8;
  string local_a0 [32];
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  string local_70 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined1 local_40 [24];
  vector<Employee,_std::allocator<Employee>_> employees;
  char **param_1_local;
  int param_0_local;
  
  lambda_filter.age_thresh._7_1_ = 1;
  local_138 = &local_130;
  employees.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)param_2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"Fatih",&local_139);
  local_130.gender = Male;
  local_130.age = 0x23;
  local_130.salary = 8500.0;
  local_138 = (Employee *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_100,"Elif",(allocator<char> *)((long)&age_thresh + 3));
  local_e0 = 0;
  local_dc = 0x1c;
  local_d8 = 0x45c67000;
  local_138 = (Employee *)local_d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d0,"Erkin",(allocator<char> *)((long)&age_thresh + 2));
  local_b0 = 1;
  local_ac = 0x2b;
  local_a8 = 0x46147000;
  local_138 = (Employee *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_a0,"Mehmet",(allocator<char> *)((long)&age_thresh + 1));
  local_80 = 1;
  local_7c = 0x2e;
  local_78 = 0x46241000;
  local_138 = (Employee *)local_70;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"Melis",(allocator<char> *)&age_thresh);
  local_50 = 0;
  local_4c = 0x30;
  local_48 = 0x46435000;
  lambda_filter.age_thresh._7_1_ = 0;
  local_40._0_8_ = &local_130;
  local_40._8_8_ = 5;
  this = (allocator<Employee> *)((long)&lambda_filter.age_thresh + 6);
  std::allocator<Employee>::allocator(this);
  __l_00._M_len = local_40._8_8_;
  __l_00._M_array = (iterator)local_40._0_8_;
  std::vector<Employee,_std::allocator<Employee>_>::vector
            ((vector<Employee,_std::allocator<Employee>_> *)(local_40 + 0x10),__l_00,this);
  std::allocator<Employee>::~allocator((allocator<Employee> *)((long)&lambda_filter.age_thresh + 6))
  ;
  local_378 = (Employee *)local_40;
  do {
    local_378 = local_378 + -1;
    Employee::~Employee(local_378);
  } while (local_378 != &local_130);
  std::allocator<char>::~allocator((allocator<char> *)&age_thresh);
  std::allocator<char>::~allocator((allocator<char> *)((long)&age_thresh + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&age_thresh + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&age_thresh + 3));
  std::allocator<char>::~allocator(&local_139);
  poVar1 = std::operator<<((ostream *)&std::cout,"First Employee:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  e = std::vector<Employee,_std::allocator<Employee>_>::operator[]
                ((vector<Employee,_std::allocator<Employee>_> *)(local_40 + 0x10),0);
  poVar1 = operator<<(poVar1,e);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"All Employees:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)(local_40 + 0x10));
  lambda_filter.age_thresh._0_4_ = 0x28;
  poVar1 = std::operator<<((ostream *)&std::cout,"Employees older than 40 years old:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_180 = (int *)&lambda_filter;
  age_gt_40.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_180;
  filter<std::vector<Employee,std::allocator<Employee>>,main::__0>
            ((vector<Employee,_std::allocator<Employee>_> *)local_178,
             (vector<Employee,_std::allocator<Employee>_> *)(local_40 + 0x10),
             (anon_class_8_1_3dfc913a)local_180);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)local_178);
  lambda_filter.age_thresh._0_4_ = 0x2d;
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Employees older than 45 years old (again in functional composition):");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  operator&<std::vector<Employee,_std::allocator<Employee>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week8_midterm_cpp:183:26)>
            (&local_198,(vector<Employee,_std::allocator<Employee>_> *)(local_40 + 0x10),
             (anon_class_8_1_3dfc913a)
             age_gt_40.super__Vector_base<Employee,_std::allocator<Employee>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  operator|<std::vector<Employee,_std::allocator<Employee>_>_>(&local_198);
  std::vector<Employee,_std::allocator<Employee>_>::~vector(&local_198);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Female employees who take less salary than 9000TL:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  filter<std::vector<Employee,std::allocator<Employee>>,main::__1>(local_1c0,local_40 + 0x10);
  print<std::vector<Employee,_std::allocator<Employee>_>_>
            ((vector<Employee,_std::allocator<Employee>_> *)local_1c0);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)local_1c0);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Employees grouped by age ranges of 10 year increments:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  group_by_abi_cxx11_<std::vector<Employee,std::allocator<Employee>>,main::__2>
            (local_1f8,local_40 + 0x10);
  print<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
              *)local_1f8);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Number of employees available in age ranges of 10 year increments:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  grouped_transformed._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  transform<std::__cxx11::string,std::vector<Employee,std::allocator<Employee>>,main::__3>
            (local_230,local_1f8);
  print<std::__cxx11::string,unsigned_long>
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
              *)local_230);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Number of employees available in age ranges of 10 year increments (again):"
                          );
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  operator|<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week8_midterm_cpp:219:29)>
            (&local_268,local_1f8);
  operator|<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>_>
            (&local_268);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map(&local_268);
  local_284 = 10;
  local_280 = 0x14;
  local_27c = 0x1e;
  local_298 = (_Type)operator|<std::array<int,_3UL>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_furkankirac[P]cs321_2020_21_fall_week8_midterm_cpp:238:38)>
                               (&local_284);
  local_278 = local_298;
  operator|<std::array<int,_3UL>_>(local_278);
  local_2bc._M_elems[0] = 1.1;
  local_2bc._M_elems[1] = 2.2;
  local_2bc._M_elems[2] = 3.3;
  local_2bc._M_elems[3] = 4.4;
  aVar2 = operator-<std::array<float,_4UL>_>(&local_2bc);
  local_408 = aVar2._M_elems[2];
  fStack_404 = aVar2._M_elems[3];
  local_3f8 = aVar2._M_elems[0];
  fStack_3f4 = aVar2._M_elems[1];
  local_2ac = local_3f8;
  fStack_2a8 = fStack_3f4;
  local_2a4 = local_408;
  fStack_2a0 = fStack_404;
  operator|<std::array<float,_4UL>_>(&local_2ac);
  local_310[0] = 1.1;
  local_310[1] = 2.2;
  local_310[2] = 3.3;
  local_310[3] = 4.4;
  local_300 = local_310;
  local_2f8 = 4;
  std::allocator<float>::allocator(&local_311);
  __l._M_len = local_2f8;
  __l._M_array = local_300;
  std::vector<float,_std::allocator<float>_>::vector(&local_2f0,__l,&local_311);
  operator-<std::vector<float,_std::allocator<float>_>_>(&local_2d8,&local_2f0);
  operator|<std::vector<float,_std::allocator<float>_>_>(&local_2d8);
  std::vector<float,_std::allocator<float>_>::~vector(&local_2d8);
  std::vector<float,_std::allocator<float>_>::~vector(&local_2f0);
  std::allocator<float>::~allocator(&local_311);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)local_230);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Employee,_std::allocator<Employee>_>_>_>_>
          *)local_1f8);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)local_178);
  std::vector<Employee,_std::allocator<Employee>_>::~vector
            ((vector<Employee,_std::allocator<Employee>_> *)(local_40 + 0x10));
  return 0;
}

Assistant:

int main(int, char* [])
{
    auto employees = std::vector<Employee>{
        {"Fatih", Male, 35, 8500},
        {"Elif", Female, 28, 6350},
        {"Erkin", Male, 43, 9500},
        {"Mehmet", Male, 46, 10500},
        {"Melis", Female, 48, 12500},
        };

    // Q1) (5pts) Make employee directly sendable to the console
    std::cout << "First Employee:" << std::endl << employees[0] << std::endl;
    // Fatih, Male, 35, 8500TL

    // Q2) (5pts) Create a print overload that can print "employees" variable
    std::cout << "All Employees:" << std::endl;
    print(employees);
    // [Fatih, Male, 35, 8500TL]; [Elif, Female, 28, 6350TL]; [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    auto age_thresh = 40;

    // Q3) (5pts) Create a filter overload that can work with any kind of containers. Make it work with "employees"
    std::cout << "Employees older than 40 years old:" << std::endl;
    auto lambda_filter = [&age_thresh](const Employee& e) { return e.age > age_thresh; };
    auto age_gt_40 = filter(employees, lambda_filter);
    print(age_gt_40);
    // [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q4a) (5pts) Apply filter to a container by & operator
    // Q4b) (5pts) Send container to console by piping it to PRINT with | operator.
    age_thresh = 45;
    std::cout << "Employees older than 45 years old (again in functional composition):" << std::endl;
    employees & lambda_filter | PRINT;
    // [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q5) (5pts) Make below code work.
    std::cout << "Female employees who take less salary than 9000TL:" << std::endl;
    print(filter(employees, [](const Employee& e) { return e.salary < 9000 && e.gender == Female; }));
    // [Elif, Female, 28, 6350TL]

    // Q6a) (15pts) Create a group_by algorithm that can group elements of a container by a specific criterion
    // Q6b) (5pts) Group employees by age ranges of 10 year increments by filling in lambda_group below
    // Q6c) (5pts) Make the grouped result printable via print(grouped) as below
    std::cout << "Employees grouped by age ranges of 10 year increments:" << std::endl;
    auto lambda_group = [](const Employee& e) {
        auto a = e.age/10*10; // note: division of integer truncates the result.
        auto b = a+9;
        return std::to_string(a) + ".." + std::to_string(b);
    };
    auto grouped = group_by(employees, lambda_group);
    print(grouped);
    // <20..29>: [Elif, Female, 28, 6350TL]
    // <30..39>: [Fatih, Male, 35, 8500TL]
    // <40..49>: [Erkin, Male, 43, 9500TL]; [Mehmet, Male, 46, 10500TL]; [Melis, Female, 48, 12500TL]

    // Q7a) (10pts) Create a transform algorithm that can work on "grouped" variable.
    // Q7b) (5pts) Write necessary transformation lambda for aggregating each group's element count.
    // Q7c) (5pts) Make the grouped and transformed result printable via print(grouped_transformed) as below
    std::cout << "Number of employees available in age ranges of 10 year increments:" << std::endl;
    auto lambda_transform = [](const auto& pair) {
        using Key = typename remove_const<decltype(pair.first)>::type;
        using Value = size_t;
        return std::pair<Key, Value>{pair.first, pair.second.size()};
    };
    auto grouped_transformed = transform(grouped, lambda_transform);
    print(grouped_transformed);
    // <20..29>: 1
    // <30..39>: 1
    // <40..49>: 3

    // Q8) (10pts) Make the below code work as the same as Q7's code block
    std::cout << "Number of employees available in age ranges of 10 year increments (again):" << std::endl;
    grouped | lambda_transform | PRINT;
    // <20..29>: 1
    // <30..39>: 1
    // <40..49>: 3

    // Q9) (5pts) Make below line work
    std::array<int, 3>{10, 20, 30} | [](int a) { return a*a; } | PRINT;
    // [100]; [400]; [900]

    // Q10) Overload "operator-" to get the reverse of passed container
    // Q10a) (5pts) Make it work with array containers with the result pipable to PRINT as below
    // Q10b) (5pts) Make it work with other containers with the result pipable to PRINT as below
    -std::array<float, 4>{1.1, 2.2, 3.3, 4.4} | PRINT;
    // [4.4]; [3.3]; [2.2]; [1.1]
    -std::vector<float>{1.1, 2.2, 3.3, 4.4} | PRINT;
    // [4.4]; [3.3]; [2.2]; [1.1]

    return 0;
}